

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::Decode
          (RelativeWorldCoordinates *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  RelativeWorldCoordinates *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 8) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui16RefPnt);
  pKVar2 = operator>>(pKVar2,&(this->m_DelX).super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->m_DelY).super_DataTypeBase);
  operator>>(pKVar2,&(this->m_DelZ).super_DataTypeBase);
  return;
}

Assistant:

void RelativeWorldCoordinates::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < RELATVE_WORLD_COORDINATES_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16RefPnt
           >> KDIS_STREAM m_DelX
           >> KDIS_STREAM m_DelY
           >> KDIS_STREAM m_DelZ;
}